

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::EnumOptions::Clear(EnumOptions *this)

{
  uint32_t cached_has_bits;
  EnumOptions *this_local;
  
  internal::ExtensionSet::Clear(&this->_extensions_);
  RepeatedPtrField<google::protobuf::UninterpretedOption>::Clear(&this->uninterpreted_option_);
  memset(&this->allow_alias_,0,2);
  internal::HasBits<1UL>::Clear(&this->_has_bits_);
  internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

void EnumOptions::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.EnumOptions)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _extensions_.Clear();
  uninterpreted_option_.Clear();
  ::memset(&allow_alias_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&deprecated_) -
      reinterpret_cast<char*>(&allow_alias_)) + sizeof(deprecated_));
  _has_bits_.Clear();
  _internal_metadata_.Clear<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>();
}